

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

enable_if_t<_std::is_class<typename_std::decay_t<const_float_&>_>::value,_void>
pbrt::detail::stringPrintfRecursiveWithPrecision<float_const&>
          (string *s,char *fmt,string *nextFmt,int precision,float *v)

{
  int iVar1;
  char *pcVar2;
  char *__format;
  uint in_ECX;
  string *in_RDI;
  float *in_R8;
  string str;
  size_t size;
  char *in_stack_ffffffffffffff78;
  string *s_00;
  string local_50 [32];
  string *local_30;
  float *local_28;
  uint local_1c;
  string *local_8;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_8 = in_RDI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = snprintf((char *)0x0,0,pcVar2,(double)*local_28,(ulong)local_1c);
  local_30 = (string *)(long)(iVar1 + 1);
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::resize((ulong)local_50);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
  s_00 = local_30;
  __format = (char *)std::__cxx11::string::c_str();
  snprintf(pcVar2,(size_t)s_00,__format,(double)*local_28,(ulong)local_1c);
  std::__cxx11::string::pop_back();
  std::__cxx11::string::operator+=(local_8,local_50);
  stringPrintfRecursive(s_00,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

inline typename std::enable_if_t<!std::is_class<typename std::decay_t<T>>::value, void>
stringPrintfRecursiveWithPrecision(std::string *s, const char *fmt,
                                   const std::string &nextFmt, int precision, T &&v,
                                   Args &&... args) {
    size_t size = snprintf(nullptr, 0, nextFmt.c_str(), precision, v) + 1;
    std::string str;
    str.resize(size);
    snprintf(&str[0], size, nextFmt.c_str(), precision, v);
    str.pop_back();  // remove trailing NUL
    *s += str;

    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}